

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flags_decoder.c
# Opt level: O1

lzma_ret lzma_stream_header_decode(lzma_stream_flags *options,uint8_t *in)

{
  uint32_t uVar1;
  lzma_ret lVar2;
  
  lVar2 = LZMA_FORMAT_ERROR;
  if (*(short *)(in + 4) == 0x5a && *(int *)in == 0x587a37fd) {
    uVar1 = lzma_crc32(in + 6,2,0);
    lVar2 = LZMA_DATA_ERROR;
    if (((uVar1 == *(uint32_t *)(in + 8)) && (lVar2 = LZMA_OPTIONS_ERROR, in[6] == '\0')) &&
       (in[7] < 0x10)) {
      options->version = 0;
      options->check = in[7] & 0xf;
      options->backward_size = 0xffffffffffffffff;
      lVar2 = LZMA_OK;
    }
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_stream_header_decode(lzma_stream_flags *options, const uint8_t *in)
{
	// Magic
	if (memcmp(in, lzma_header_magic, sizeof(lzma_header_magic)) != 0)
		return LZMA_FORMAT_ERROR;

	// Verify the CRC32 so we can distinguish between corrupt
	// and unsupported files.
	const uint32_t crc = lzma_crc32(in + sizeof(lzma_header_magic),
			LZMA_STREAM_FLAGS_SIZE, 0);
	if (crc != read32le(in + sizeof(lzma_header_magic)
			+ LZMA_STREAM_FLAGS_SIZE))
		return LZMA_DATA_ERROR;

	// Stream Flags
	if (stream_flags_decode(options, in + sizeof(lzma_header_magic)))
		return LZMA_OPTIONS_ERROR;

	// Set Backward Size to indicate unknown value. That way
	// lzma_stream_flags_compare() can be used to compare Stream Header
	// and Stream Footer while keeping it useful also for comparing
	// two Stream Footers.
	options->backward_size = LZMA_VLI_UNKNOWN;

	return LZMA_OK;
}